

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall AMPLSOption::AMPLSOption(AMPLSOption *this,char *name,char *descr,Option_Type type)

{
  char *pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,(ulong)name);
  pcVar1 = (char *)(this->description)._M_string_length;
  strlen(descr);
  std::__cxx11::string::_M_replace((ulong)&this->description,0,pcVar1,(ulong)descr);
  this->type = type;
  return;
}

Assistant:

AMPLSOption(const char* name, const char* descr, mp::SolverOption::Option_Type type) {
    this->name = name;
    this->description = descr;
    this->type = type;
  }